

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processvid.cpp
# Opt level: O0

vector<Image,_std::allocator<Image>_> *
process_textures(vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,
                vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
                *tex_buf,pair<Texture,_Texture> last_batch_pair,
                vector<Image,_std::allocator<Image>_> *out_buf,Shader s,int starting_index)

{
  Texture2D texture;
  Texture2D texture_00;
  Texture2D texture_01;
  Texture2D texture_02;
  Texture2D texture_03;
  Texture2D texture_04;
  Texture2D texture_05;
  Texture2D texture_06;
  Texture2D texture_07;
  Texture2D texture_08;
  Texture2D texture_09;
  Image image;
  Image image_00;
  Image image_01;
  RenderTexture2D target_00;
  RenderTexture2D target_01;
  RenderTexture2D target_02;
  RenderTexture2D target_03;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  pair<Texture,_Texture> pVar10;
  bool bVar11;
  int iVar12;
  reference pvVar13;
  ostream *poVar14;
  size_type sVar15;
  pointer ppVar16;
  reference pIVar17;
  reference pvVar18;
  uint uVar19;
  int *piVar20;
  Shader shader;
  Shader shader_00;
  Shader shader_01;
  undefined4 uVar21;
  int in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  undefined4 in_stack_fffffffffffffb84;
  int in_stack_fffffffffffffb88;
  undefined1 local_428 [8];
  undefined8 uStack_420;
  undefined8 local_418;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined8 uStack_404;
  undefined1 local_3f8 [8];
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined8 uStack_3d4;
  undefined4 local_3cc;
  Texture local_3c0;
  undefined1 local_3a8 [44];
  undefined4 local_37c;
  undefined8 local_378;
  undefined8 local_360;
  int *local_358;
  undefined4 local_34c;
  undefined1 local_348 [8];
  undefined8 uStack_340;
  undefined8 local_338;
  int iStack_330;
  int iStack_32c;
  undefined4 uStack_328;
  undefined8 uStack_324;
  undefined8 local_318;
  int *local_310;
  ulong local_308;
  int *local_300;
  pair<Texture,_Texture> *local_2f8;
  Texture2D local_2f0;
  int iStack_2dc;
  undefined1 local_2d8 [24];
  Texture2D local_2c0;
  int iStack_2ac;
  Texture2D local_2a8;
  int iStack_294;
  Texture2D local_290;
  int iStack_27c;
  Texture2D local_278;
  int iStack_264;
  Texture2D local_260;
  int iStack_24c;
  Texture2D local_248;
  undefined8 uStack_230;
  undefined8 local_228;
  int iStack_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined8 uStack_214;
  void *local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  pair<Texture,_Texture> *local_1ec;
  undefined1 local_1e4 [12];
  __normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_> local_1d8;
  __normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_> local_1d0;
  __normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_> local_1c8;
  void *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  pair<Texture,_Texture> *local_1a4;
  undefined1 local_19c [12];
  __normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_> local_190;
  __normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_> local_188;
  void *local_180;
  undefined8 local_178;
  undefined8 local_170;
  int local_164;
  int iStack_160;
  undefined1 local_15c [12];
  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
  local_150;
  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
  local_148;
  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
  local_140;
  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
  local_138;
  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
  local_130;
  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
  local_128;
  int local_120;
  char local_119;
  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
  local_118;
  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
  local_110;
  iterator it;
  Texture2D processed_older;
  Texture2D processed_previous;
  Texture2D bg_previous;
  Texture2D fg_previous;
  Texture2D bg;
  Texture2D fg;
  int log_index;
  RenderTexture2D target;
  RenderTexture2D sampler;
  int starting_index_local;
  vector<Image,_std::allocator<Image>_> *out_buf_local;
  vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_> *tex_buf_local;
  Shader s_local;
  
  pVar10 = last_batch_pair;
  piVar20 = s.locs;
  uVar19 = s.id;
  LoadRenderTexture((RenderTexture2D *)&target.depth.mipmaps,(int)(res.x * 2.0),(int)(res.y * 3.0));
  LoadRenderTexture((RenderTexture2D *)&fg.format,(int)res.x,(int)res.y);
  bg_previous.mipmaps = last_batch_pair.first.id;
  bg_previous.format = last_batch_pair.first.width;
  last_batch_pair.first._8_8_ = pVar10.first._8_8_;
  fg_previous.id = last_batch_pair.first.height;
  fg_previous.width = last_batch_pair.first.mipmaps;
  last_batch_pair.first.format = pVar10.first.format;
  fg_previous.height = last_batch_pair.first.format;
  last_batch_pair.second._0_8_ = pVar10.second._0_8_;
  processed_previous.mipmaps = last_batch_pair.second.id;
  processed_previous.format = last_batch_pair.second.width;
  last_batch_pair.second._8_8_ = pVar10.second._8_8_;
  bg_previous.id = last_batch_pair.second.height;
  bg_previous.width = last_batch_pair.second.mipmaps;
  last_batch_pair.second.format = pVar10.second.format;
  bg_previous.height = last_batch_pair.second.format;
  fg.mipmaps = starting_index;
  pvVar13 = std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
            ::front(tex_buf);
  processed_older.mipmaps = (pvVar13->first).id;
  processed_older.format = (pvVar13->first).width;
  processed_previous.id = (pvVar13->first).height;
  processed_previous.width = (pvVar13->first).mipmaps;
  processed_previous.height = (pvVar13->first).format;
  pvVar13 = std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
            ::front(tex_buf);
  it._M_current = *(pair<Texture,_Texture> **)&pvVar13->second;
  processed_older.id = (pvVar13->second).height;
  processed_older.width = (pvVar13->second).mipmaps;
  processed_older.height = (pvVar13->second).format;
  poVar14 = std::operator<<((ostream *)&std::cout,"processing inputs ");
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,starting_index);
  poVar14 = std::operator<<(poVar14," to ");
  sVar15 = std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>::
           size(tex_buf);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,(long)starting_index + sVar15);
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  local_110._M_current =
       (pair<Texture,_Texture> *)
       std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>::
       begin(tex_buf);
  while( true ) {
    local_118._M_current =
         (pair<Texture,_Texture> *)
         std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>::
         end(tex_buf);
    bVar11 = __gnu_cxx::operator!=(&local_110,&local_118);
    if (!bVar11) break;
    poVar14 = std::operator<<((ostream *)&std::cout,"\tprocessing ");
    in_stack_fffffffffffffb88 = (int)poVar14;
    local_119 = (char)std::setfill<char>('0');
    poVar14 = std::operator<<(in_stack_fffffffffffffb88,local_119);
    local_120 = (int)std::setw(digit_num);
    poVar14 = std::operator<<(poVar14,(_Setw)local_120);
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,fg.mipmaps);
    poVar14 = std::operator<<(poVar14,"/");
    sVar15 = std::vector<Image,_std::allocator<Image>_>::size(out_buf);
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,sVar15);
    poVar14 = std::operator<<(poVar14,"... ");
    std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
    if ((swap_fg_bg & 1U) == 0) {
      ppVar16 = __gnu_cxx::
                __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
                ::operator->(&local_110);
      bg.mipmaps = (ppVar16->first).id;
      bg.format = (ppVar16->first).width;
      fg.id = (ppVar16->first).height;
      fg.width = (ppVar16->first).mipmaps;
      fg.height = (ppVar16->first).format;
      ppVar16 = __gnu_cxx::
                __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
                ::operator->(&local_110);
      fg_previous.mipmaps = (ppVar16->second).id;
      fg_previous.format = (ppVar16->second).width;
      bg.id = (ppVar16->second).height;
      bg.width = (ppVar16->second).mipmaps;
      bg.height = (ppVar16->second).format;
      local_140._M_current =
           (pair<Texture,_Texture> *)
           std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>::
           begin(tex_buf);
      bVar11 = __gnu_cxx::operator!=(&local_110,&local_140);
      if (bVar11) {
        local_148 = __gnu_cxx::
                    __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
                    ::operator-(&local_110,1);
        ppVar16 = __gnu_cxx::
                  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
                  ::operator->(&local_148);
        bg_previous.mipmaps = (ppVar16->first).id;
        bg_previous.format = (ppVar16->first).width;
        fg_previous.id = (ppVar16->first).height;
        fg_previous.width = (ppVar16->first).mipmaps;
        fg_previous.height = (ppVar16->first).format;
        local_150 = __gnu_cxx::
                    __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
                    ::operator-(&local_110,1);
        ppVar16 = __gnu_cxx::
                  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
                  ::operator->(&local_150);
        processed_previous.mipmaps = (ppVar16->second).id;
        processed_previous.format = (ppVar16->second).width;
        bg_previous.id = (ppVar16->second).height;
        bg_previous.width = (ppVar16->second).mipmaps;
        bg_previous.height = (ppVar16->second).format;
      }
    }
    else {
      ppVar16 = __gnu_cxx::
                __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
                ::operator->(&local_110);
      bg.mipmaps = (ppVar16->second).id;
      bg.format = (ppVar16->second).width;
      fg.id = (ppVar16->second).height;
      fg.width = (ppVar16->second).mipmaps;
      fg.height = (ppVar16->second).format;
      ppVar16 = __gnu_cxx::
                __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
                ::operator->(&local_110);
      fg_previous.mipmaps = (ppVar16->first).id;
      fg_previous.format = (ppVar16->first).width;
      bg.id = (ppVar16->first).height;
      bg.width = (ppVar16->first).mipmaps;
      bg.height = (ppVar16->first).format;
      local_128._M_current =
           (pair<Texture,_Texture> *)
           std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>::
           begin(tex_buf);
      bVar11 = __gnu_cxx::operator!=(&local_110,&local_128);
      if (bVar11) {
        local_130 = __gnu_cxx::
                    __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
                    ::operator-(&local_110,1);
        ppVar16 = __gnu_cxx::
                  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
                  ::operator->(&local_130);
        bg_previous.mipmaps = (ppVar16->second).id;
        bg_previous.format = (ppVar16->second).width;
        fg_previous.id = (ppVar16->second).height;
        fg_previous.width = (ppVar16->second).mipmaps;
        fg_previous.height = (ppVar16->second).format;
        local_138 = __gnu_cxx::
                    __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
                    ::operator-(&local_110,1);
        ppVar16 = __gnu_cxx::
                  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
                  ::operator->(&local_138);
        processed_previous.mipmaps = (ppVar16->first).id;
        processed_previous.format = (ppVar16->first).width;
        bg_previous.id = (ppVar16->first).height;
        bg_previous.width = (ppVar16->first).mipmaps;
        bg_previous.height = (ppVar16->first).format;
      }
    }
    sVar15 = std::vector<Image,_std::allocator<Image>_>::size(out_buf);
    if (1 < sVar15) {
      local_190._M_current = (Image *)std::vector<Image,_std::allocator<Image>_>::end(out_buf);
      local_188 = __gnu_cxx::__normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_>
                  ::operator-(&local_190,1);
      pIVar17 = __gnu_cxx::__normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_>::
                operator*(&local_188);
      local_180 = pIVar17->data;
      local_178._0_4_ = pIVar17->width;
      local_178._4_4_ = pIVar17->height;
      local_170._0_4_ = pIVar17->mipmaps;
      local_170._4_4_ = pIVar17->format;
      uVar1 = pIVar17->width;
      uVar2 = pIVar17->height;
      uVar3 = pIVar17->mipmaps;
      image.width = uVar3;
      image.data._4_4_ = uVar2;
      image.data._0_4_ = uVar1;
      image.height = local_170._4_4_;
      image.mipmaps = in_stack_fffffffffffffb70;
      image.format = in_stack_fffffffffffffb74;
      LoadTextureFromImage(image);
      processed_older.mipmaps = local_164;
      processed_older.format = iStack_160;
      processed_previous.id = local_15c._0_4_;
      processed_previous.width = local_15c._4_4_;
      processed_previous.height = local_15c._8_4_;
      sVar15 = std::vector<Image,_std::allocator<Image>_>::size(out_buf);
      if (num_frames_back < sVar15) {
        local_1d8._M_current = (Image *)std::vector<Image,_std::allocator<Image>_>::end(out_buf);
        local_1d0 = __gnu_cxx::
                    __normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_>::
                    operator-(&local_1d8,1);
        local_1c8 = __gnu_cxx::
                    __normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_>::
                    operator-(&local_1d0,(ulong)num_frames_back);
        pIVar17 = __gnu_cxx::__normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_>
                  ::operator*(&local_1c8);
        local_1c0 = pIVar17->data;
        local_1b8._0_4_ = pIVar17->width;
        local_1b8._4_4_ = pIVar17->height;
        local_1b0._0_4_ = pIVar17->mipmaps;
        local_1b0._4_4_ = pIVar17->format;
        uVar4 = pIVar17->width;
        uVar5 = pIVar17->height;
        uVar6 = pIVar17->mipmaps;
        image_00.width = uVar6;
        image_00.data._4_4_ = uVar5;
        image_00.data._0_4_ = uVar4;
        image_00.height = local_1b0._4_4_;
        image_00.mipmaps = in_stack_fffffffffffffb70;
        image_00.format = in_stack_fffffffffffffb74;
        LoadTextureFromImage(image_00);
        it._M_current = local_1a4;
        processed_older.id = local_19c._0_4_;
        processed_older.width = local_19c._4_4_;
        processed_older.height = local_19c._8_4_;
      }
      else {
        pvVar18 = std::vector<Image,_std::allocator<Image>_>::back(out_buf);
        local_208 = pvVar18->data;
        local_200._0_4_ = pvVar18->width;
        local_200._4_4_ = pvVar18->height;
        local_1f8._0_4_ = pvVar18->mipmaps;
        local_1f8._4_4_ = pvVar18->format;
        uVar7 = pvVar18->width;
        uVar8 = pvVar18->height;
        uVar9 = pvVar18->mipmaps;
        image_01.width = uVar9;
        image_01.data._4_4_ = uVar8;
        image_01.data._0_4_ = uVar7;
        image_01.height = local_1f8._4_4_;
        image_01.mipmaps = in_stack_fffffffffffffb70;
        image_01.format = in_stack_fffffffffffffb74;
        LoadTextureFromImage(image_01);
        it._M_current = local_1ec;
        processed_older.id = local_1e4._0_4_;
        processed_older.width = local_1e4._4_4_;
        processed_older.height = local_1e4._8_4_;
      }
    }
    memcpy(&local_248.format,&target.depth.mipmaps,0x2c);
    uVar21 = (undefined4)((ulong)local_228 >> 0x20);
    target_00.texture.width = (int)local_228;
    target_00.id = (undefined4)uStack_230;
    target_00.texture.id = uStack_230._4_4_;
    target_00.texture.height = uVar21;
    target_00.texture.mipmaps = iStack_220;
    target_00.texture.format = uStack_21c;
    target_00.depth.id = uStack_218;
    target_00.depth.width = (undefined4)uStack_214;
    target_00.depth.height = uStack_214._4_4_;
    target_00.depth.mipmaps = in_stack_fffffffffffffb84;
    target_00.depth.format = in_stack_fffffffffffffb88;
    iVar12 = iStack_220;
    BeginTextureMode(target_00);
    local_248.mipmaps = -1;
    ClearBackground((Color)0xffffffff);
    local_260.format = bg.mipmaps;
    iStack_24c = bg.format;
    local_248.id = fg.id;
    local_248.width = fg.width;
    local_248.height = fg.height;
    local_260.mipmaps = 0xffffffff;
    texture.height = fg.id;
    texture.mipmaps = fg.width;
    texture.id = bg.mipmaps;
    texture.width = bg.format;
    texture.format = fg.height;
    DrawTexture(texture,0,0,(Color)0xffffffff);
    local_278.format = bg_previous.mipmaps;
    iStack_264 = bg_previous.format;
    local_260.id = fg_previous.id;
    local_260.width = fg_previous.width;
    local_260.height = fg_previous.height;
    local_278.mipmaps = 0xffffffff;
    texture_00.height = fg_previous.id;
    texture_00.mipmaps = fg_previous.width;
    texture_00.id = bg_previous.mipmaps;
    texture_00.width = bg_previous.format;
    texture_00.format = fg_previous.height;
    DrawTexture(texture_00,(int)res.x,0,(Color)0xffffffff);
    local_290.format = fg_previous.mipmaps;
    iStack_27c = fg_previous.format;
    local_278.id = bg.id;
    local_278.width = bg.width;
    local_278.height = bg.height;
    local_290.mipmaps = 0xffffffff;
    texture_01.height = bg.id;
    texture_01.mipmaps = bg.width;
    texture_01.id = fg_previous.mipmaps;
    texture_01.width = fg_previous.format;
    texture_01.format = bg.height;
    DrawTexture(texture_01,0,(int)res.y,(Color)0xffffffff);
    local_2a8.format = processed_previous.mipmaps;
    iStack_294 = processed_previous.format;
    local_290.id = bg_previous.id;
    local_290.width = bg_previous.width;
    local_290.height = bg_previous.height;
    local_2a8.mipmaps = 0xffffffff;
    texture_02.height = bg_previous.id;
    texture_02.mipmaps = bg_previous.width;
    texture_02.id = processed_previous.mipmaps;
    texture_02.width = processed_previous.format;
    texture_02.format = bg_previous.height;
    DrawTexture(texture_02,(int)res.x,(int)res.y,(Color)0xffffffff);
    local_2c0.format = processed_older.mipmaps;
    iStack_2ac = processed_older.format;
    local_2a8.id = processed_previous.id;
    local_2a8.width = processed_previous.width;
    local_2a8.height = processed_previous.height;
    local_2c0.mipmaps = 0xffffffff;
    texture_03.height = processed_previous.id;
    texture_03.mipmaps = processed_previous.width;
    texture_03.id = processed_older.mipmaps;
    texture_03.width = processed_older.format;
    texture_03.format = processed_previous.height;
    DrawTexture(texture_03,0,(int)(res.y * 2.0),(Color)0xffffffff);
    local_2d8._16_8_ = it._M_current;
    local_2c0.id = processed_older.id;
    local_2c0.width = processed_older.width;
    local_2c0.height = processed_older.height;
    local_2d8._12_4_ = 0xffffffff;
    texture_04.height = processed_older.id;
    texture_04.mipmaps = processed_older.width;
    texture_04._0_8_ = it._M_current;
    texture_04.format = processed_older.height;
    DrawTexture(texture_04,(int)res.x,(int)(res.y * 2.0),(Color)0xffffffff);
    EndTextureMode();
    local_2f0.format = processed_older.mipmaps;
    iStack_2dc = processed_older.format;
    local_2d8._0_4_ = processed_previous.id;
    local_2d8._4_4_ = processed_previous.width;
    local_2d8._8_4_ = processed_previous.height;
    texture_07.height = processed_previous.height;
    texture_07.id = processed_previous.id;
    texture_07.width = processed_previous.width;
    texture_07.mipmaps = uVar21;
    texture_07.format = iVar12;
    UnloadTexture(texture_07);
    local_2f8 = it._M_current;
    local_2f0.id = processed_older.id;
    local_2f0.width = processed_older.width;
    local_2f0.height = processed_older.height;
    texture_08.height = processed_older.height;
    texture_08.id = processed_older.id;
    texture_08.width = processed_older.width;
    texture_08.mipmaps = uVar21;
    texture_08.format = iVar12;
    UnloadTexture(texture_08);
    local_308 = CONCAT44(tex_buf_local._4_4_,uVar19);
    local_318 = CONCAT44(tex_buf_local._4_4_,uVar19);
    shader._4_4_ = 0;
    shader.id = uVar19;
    shader.locs = piVar20;
    local_310 = piVar20;
    local_300 = piVar20;
    iVar12 = GetShaderLocation(shader,"progress");
    shader_00._0_8_ = local_308 & 0xffffffff;
    shader_00.locs = local_300;
    SetShaderValue(shader_00,iVar12,&fg.mipmaps,4);
    memcpy(local_348,&fg.format,0x2c);
    uVar21 = (undefined4)((ulong)local_338 >> 0x20);
    target_01.texture.width = (int)local_338;
    target_01.id = (undefined4)uStack_340;
    target_01.texture.id = uStack_340._4_4_;
    target_01.texture.height = uVar21;
    target_01.texture.mipmaps = iStack_330;
    target_01.texture.format = iStack_32c;
    target_01.depth.id = uStack_328;
    target_01.depth.width = (undefined4)uStack_324;
    target_01.depth.height = uStack_324._4_4_;
    target_01.depth.mipmaps = in_stack_fffffffffffffb84;
    target_01.depth.format = in_stack_fffffffffffffb88;
    in_stack_fffffffffffffb70 = iStack_330;
    in_stack_fffffffffffffb74 = iStack_32c;
    BeginTextureMode(target_01);
    local_34c = 0xffffffff;
    ClearBackground((Color)0xffffffff);
    local_360 = CONCAT44(tex_buf_local._4_4_,uVar19);
    shader_01._4_4_ = 0;
    shader_01.id = uVar19;
    shader_01.locs = piVar20;
    local_358 = piVar20;
    BeginShaderMode(shader_01);
    local_378 = stack0xffffffffffffffa4;
    local_37c = 0xffffffff;
    texture_05._8_8_ = sampler.texture._0_8_;
    texture_05.id = target.depth.format;
    texture_05.width = sampler.id;
    texture_05.format = sampler.texture.height;
    DrawTexture(texture_05,0,0,(Color)0xffffffff);
    EndShaderMode();
    EndTextureMode();
    local_3a8._0_4_ = target.texture.id;
    local_3a8._4_4_ = target.texture.width;
    local_3a8._8_4_ = target.texture.height;
    texture_09.height = target.texture.height;
    texture_09.id = target.texture.id;
    texture_09.width = target.texture.width;
    texture_09.mipmaps = uVar21;
    texture_09.format = in_stack_fffffffffffffb70;
    GetTextureData(texture_09);
    std::vector<Image,_std::allocator<Image>_>::push_back(out_buf,(value_type *)(local_3a8 + 0x10));
    BeginDrawing();
    local_3c0.id = target.texture.id;
    local_3c0.width = target.texture.width;
    local_3c0.height = target.texture.height;
    local_3cc = 0xffffffff;
    texture_06.height = target.texture.id;
    texture_06.mipmaps = target.texture.width;
    texture_06._0_8_ = _log_index;
    texture_06.format = target.texture.height;
    DrawTexture(texture_06,0,0,(Color)0xffffffff);
    EndDrawing();
    fg.mipmaps = fg.mipmaps + 1;
    __gnu_cxx::
    __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
    ::operator++(&local_110);
  }
  memcpy(local_3f8,&target.depth.mipmaps,0x2c);
  target_02.texture.width = (int)local_3e8;
  target_02.id = (undefined4)uStack_3f0;
  target_02.texture.id = uStack_3f0._4_4_;
  target_02.texture.height = (int)((ulong)local_3e8 >> 0x20);
  target_02.texture.mipmaps = uStack_3e0;
  target_02.texture.format = uStack_3dc;
  target_02.depth.id = uStack_3d8;
  target_02.depth.width = (undefined4)uStack_3d4;
  target_02.depth.height = uStack_3d4._4_4_;
  target_02.depth.mipmaps = in_stack_fffffffffffffb84;
  target_02.depth.format = in_stack_fffffffffffffb88;
  UnloadRenderTexture(target_02);
  memcpy(local_428,&fg.format,0x2c);
  target_03.texture.width = (int)local_418;
  target_03.id = (undefined4)uStack_420;
  target_03.texture.id = uStack_420._4_4_;
  target_03.texture.height = (int)((ulong)local_418 >> 0x20);
  target_03.texture.mipmaps = uStack_410;
  target_03.texture.format = uStack_40c;
  target_03.depth.id = uStack_408;
  target_03.depth.width = (undefined4)uStack_404;
  target_03.depth.height = uStack_404._4_4_;
  target_03.depth.mipmaps = in_stack_fffffffffffffb84;
  target_03.depth.format = in_stack_fffffffffffffb88;
  UnloadRenderTexture(target_03);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::vector<Image,_std::allocator<Image>_>::vector(__return_storage_ptr__,out_buf);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> process_textures(
	std::vector<std::pair<Texture2D,Texture2D>> tex_buf,
	std::pair<Texture2D,Texture2D> last_batch_pair,
	std::vector<Image> out_buf,
	Shader s,
	int starting_index)
{

	// Create a RenderTexture2D to use as a canvas
    RenderTexture2D sampler = LoadRenderTexture(res.x*2, res.y*3);
	RenderTexture2D target = LoadRenderTexture(res.x, res.y);
	
	//iterate through all the textures in the vector
	int log_index = starting_index;
	Texture2D fg, bg;
	Texture2D fg_previous = last_batch_pair.first;
	Texture2D bg_previous = last_batch_pair.second;
	Texture2D processed_previous = tex_buf.front().first;
	Texture2D processed_older = tex_buf.front().second;

	std::cout << "processing inputs " << starting_index
		<< " to " << (starting_index+tex_buf.size()) << std::endl;
	for (auto it = tex_buf.begin(); it != tex_buf.end(); ++it) {
		std::cout << "\tprocessing "
			<< std::setfill('0') << std::setw(digit_num) << log_index
			<< "/" << out_buf.size() << "... " << std::endl;

		if (swap_fg_bg) {
			fg = it->second;
			bg = it->first;
			if (it != tex_buf.begin()) {
				fg_previous = (it-1)->second;
				bg_previous = (it-1)->first;
			}
		} else {
			fg = it->first;
			bg = it->second;
			if (it != tex_buf.begin()) {
				fg_previous = (it-1)->first;
				bg_previous = (it-1)->second;
			}
		}


		if (out_buf.size() > 1) {
			processed_previous = LoadTextureFromImage(*(out_buf.end()-1));
			//if num_frames_back > out.size,
			//return the texture using modulo operation
			if (out_buf.size() > num_frames_back) {
				processed_older
					= LoadTextureFromImage(*(out_buf.end()-1-num_frames_back));
			} else processed_older = LoadTextureFromImage(out_buf.back());
		}

		/* raylib doesn't allow uploading sampler2Ds to GPU.
		 * so instead, I draw the necessary textures to a very tall render
		 * texture called "sampler with textures arranged like this:
		 * 		current foreground texture	|	previous foreground texture
		 * 		current background texture	|	previous background texture
		 * 		previous processed texture	|	older processed texture
		 */
		BeginTextureMode(sampler);
			ClearBackground(WHITE);
			DrawTexture(fg, 				0, 		0, 			WHITE);
			DrawTexture(fg_previous, 		res.x, 	0, 			WHITE);
			DrawTexture(bg, 				0, 		res.y,		WHITE);
			DrawTexture(bg_previous,		res.x,	res.y,		WHITE);
			DrawTexture(processed_previous,	0,		res.y*2,	WHITE);
			DrawTexture(processed_older,	res.x,	res.y*2,	WHITE);
		EndTextureMode();
		
		//unload the temporary textures
		UnloadTexture(processed_previous);
		UnloadTexture(processed_older);

		SetShaderValue(
			s,
			GetShaderLocation(s, "progress"),
			&log_index,
			SHADER_UNIFORM_INT
		);

		//now apply the shader and render to target texture
		BeginTextureMode(target);
			ClearBackground(WHITE);
			BeginShaderMode(s);
				DrawTexture(sampler.texture, 0, 0, WHITE);
			EndShaderMode();
		EndTextureMode();

		out_buf.push_back(GetTextureData(target.texture));
		
		//finally, draw on the screen
		BeginDrawing();
			DrawTexture(target.texture, 0, 0, WHITE);
		EndDrawing();

		++log_index;
	}

	UnloadRenderTexture(sampler);
	UnloadRenderTexture(target);

	std::cout << std::endl;
	return out_buf;
}